

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * flatbuffers::NumToString<double>(string *__return_storage_ptr__,double t)

{
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  double local_18;
  double t_local;
  
  local_18 = t;
  t_local = (double)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NumToString(T t) {
  // to_string() prints different numbers of digits for floats depending on
  // platform and isn't available on Android, so we use stringstream
  std::stringstream ss;
  if (sizeof(T) > 1) ss << t;
  else ss << static_cast<int>(t);  // Avoid char types used as character data.
  return ss.str();
}